

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

int wrapped_lstat(char *path,stat *buf)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  code *UNRECOVERED_JUMPTABLE;
  curious_metadata_record_t io_args;
  undefined8 local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 uStack_30;
  
  lVar3 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar3 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[6].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    local_38 = (char *)0x0;
    uStack_30 = 6;
    local_48 = 0;
    pcStack_40 = (char *)0x0;
    curious_get_filesystem(path,&pcStack_40,&local_38);
    curious_call_callbacks(4,&local_48);
    iVar2 = (*UNRECOVERED_JUMPTABLE)(path,buf);
    local_48 = CONCAT44(local_48._4_4_,1);
    curious_call_callbacks(5,&local_48);
    *piVar1 = *piVar1 + -1;
    return iVar2;
  }
  *piVar1 = *piVar1 + -1;
  iVar2 = (*UNRECOVERED_JUMPTABLE)(path,buf);
  return iVar2;
}

Assistant:

int wrapped_lstat(const char* path, struct stat* buf)
{
    WRAPPER_ENTER(lstat);

    // Get the handle for the original function
    stat_f orig_lstat = (stat_f) gotcha_get_wrappee(io_fns[CURIOUS_LSTAT_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_LSTAT_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_lstat(path, buf);
        io_args.call_count = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, lstat);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_lstat(path, buf), lstat);
    }
}